

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O0

void check_mpp_service_cap(RK_U32 *codec_type,RK_U32 *hw_ids,MppServiceCmdCap *cap)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  ulong uVar5;
  byte local_61;
  MppServiceQueryCfg *cfg;
  MppClientType local_50;
  RK_U32 i;
  RK_U32 val;
  RK_U32 hw_support;
  RK_U32 *cmd_butt;
  RK_S32 ret;
  RK_S32 fd;
  MppReqV1 mpp_req;
  MppServiceCmdCap *cap_local;
  RK_U32 *hw_ids_local;
  RK_U32 *codec_type_local;
  
  cmd_butt._4_4_ = 0xffffffff;
  cmd_butt._0_4_ = 0;
  _val = &cap->query_cmd;
  i = 0;
  mpp_req.data_ptr = (RK_U64)cap;
  mpp_env_get_u32("mpp_device_debug",&mpp_device_debug,0);
  *codec_type = 0;
  memset(hw_ids,0,0x80);
  pcVar2 = mpp_get_mpp_service_name();
  cmd_butt._4_4_ = open64(pcVar2,0x80002);
  if (cmd_butt._4_4_ < 0) {
    _mpp_log_l(2,"mpp_serivce","open mpp_service to check cmd capability failed\n",(char *)0x0);
    memset((void *)mpp_req.data_ptr,0,0x18);
  }
  else {
    cmd_butt._0_4_ = mpp_service_ioctl(cmd_butt._4_4_,0,0,&i);
    if ((int)cmd_butt == 0) {
      if ((mpp_device_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_serivce","vcodec_support %08x\n","check_mpp_service_cap",(ulong)i);
      }
      *codec_type = i;
    }
    iVar1 = access("/proc/mpp_service/supports-cmd",0);
    local_61 = 1;
    if (iVar1 != 0) {
      iVar1 = access("/proc/mpp_service/support_cmd",0);
      local_61 = iVar1 != 0 ^ 0xff;
    }
    *(uint *)mpp_req.data_ptr = (uint)(local_61 & 1);
    if (*(int *)mpp_req.data_ptr != 0) {
      for (cfg._4_4_ = 0; cfg._4_4_ < 5; cfg._4_4_ = cfg._4_4_ + 1) {
        uVar5 = (ulong)cfg._4_4_;
        memset(&ret,0,0x18);
        local_50 = query_cfg[uVar5].cmd_butt;
        ret = 2;
        mpp_req._8_8_ = &local_50;
        cmd_butt._0_4_ = ioctl(cmd_butt._4_4_,0x40047601,&ret);
        if ((int)cmd_butt == 0) {
          *_val = local_50;
          if ((mpp_device_debug & 2) != 0) {
            _mpp_log_l(4,"mpp_serivce","query %-11s support %04x\n","check_mpp_service_cap",
                       query_cfg[uVar5].name,(ulong)local_50);
          }
        }
        else {
          pcVar2 = query_cfg[uVar5].name;
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          _mpp_log_l(2,"mpp_serivce","query %-11s support error %s.\n","check_mpp_service_cap",
                     pcVar2,pcVar4);
        }
        _val = _val + 1;
      }
    }
    close(cmd_butt._4_4_);
    for (cfg._4_4_ = VPU_CLIENT_VDPU1; cfg._4_4_ < 0x20; cfg._4_4_ = cfg._4_4_ + VPU_CLIENT_VDPU2) {
      if ((i & 1 << ((byte)cfg._4_4_ & 0x1f)) != 0) {
        local_50 = cfg._4_4_;
        pcVar2 = mpp_get_mpp_service_name();
        cmd_butt._4_4_ = open64(pcVar2,0x80002);
        if (cmd_butt._4_4_ < 0) {
          _mpp_log_l(2,"mpp_serivce","open mpp_service to check cmd capability failed\n",(char *)0x0
                    );
          return;
        }
        cmd_butt._0_4_ = mpp_service_ioctl(cmd_butt._4_4_,0x100,4,&local_50);
        if ((int)cmd_butt == 0) {
          cmd_butt._0_4_ = mpp_service_ioctl(cmd_butt._4_4_,1,4,&local_50);
          if ((int)cmd_butt == 0) {
            if ((mpp_device_debug & 2) != 0) {
              pcVar2 = strof_client_type(cfg._4_4_);
              _mpp_log_l(4,"mpp_serivce","client %-10s hw_id %08x\n","check_mpp_service_cap",pcVar2,
                         (ulong)local_50);
            }
            hw_ids[cfg._4_4_] = local_50;
          }
          else {
            pcVar2 = strof_client_type(cfg._4_4_);
            _mpp_log_l(2,"mpp_serivce","check valid client %-10s for hw_id failed\n",(char *)0x0,
                       pcVar2);
          }
        }
        else {
          _mpp_log_l(2,"mpp_serivce","check valid client type %d failed\n",(char *)0x0,
                     (ulong)cfg._4_4_);
        }
        close(cmd_butt._4_4_);
      }
    }
  }
  return;
}

Assistant:

void check_mpp_service_cap(RK_U32 *codec_type, RK_U32 *hw_ids, MppServiceCmdCap *cap)
{
    MppReqV1 mpp_req;
    RK_S32 fd = -1;
    RK_S32 ret = 0;
    RK_U32 *cmd_butt = &cap->query_cmd;;
    RK_U32 hw_support = 0;
    RK_U32 val;
    RK_U32 i;

    /* for device check on startup */
    mpp_env_get_u32("mpp_device_debug", &mpp_device_debug, 0);

    *codec_type = 0;
    memset(hw_ids, 0, sizeof(RK_U32) * 32);

    /* check hw_support flag for valid client type */
    fd = open(mpp_get_mpp_service_name(), O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        mpp_err("open mpp_service to check cmd capability failed\n");
        memset(cap, 0, sizeof(*cap));
        return ;
    }
    ret = mpp_service_ioctl(fd, MPP_CMD_PROBE_HW_SUPPORT, 0, &hw_support);
    if (!ret) {
        mpp_dev_dbg_probe("vcodec_support %08x\n", hw_support);
        *codec_type = hw_support;
    }
    cap->support_cmd = !access("/proc/mpp_service/supports-cmd", F_OK) ||
                       !access("/proc/mpp_service/support_cmd", F_OK);
    if (cap->support_cmd) {
        for (i = 0; i < query_count; i++, cmd_butt++) {
            const MppServiceQueryCfg *cfg = &query_cfg[i];

            memset(&mpp_req, 0, sizeof(mpp_req));

            val = cfg->cmd_butt;
            mpp_req.cmd = MPP_CMD_QUERY_CMD_SUPPORT;
            mpp_req.data_ptr = REQ_DATA_PTR(&val);

            ret = (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &mpp_req);
            if (ret)
                mpp_err_f("query %-11s support error %s.\n", cfg->name, strerror(errno));
            else {
                *cmd_butt = val;
                mpp_dev_dbg_probe("query %-11s support %04x\n", cfg->name, val);
            }
        }
    }
    close(fd);

    /* check each valid client type for hw_id */
    /* kernel need to set client type then get hw_id */
    for (i = 0; i < 32; i++) {
        if (hw_support & (1 << i)) {
            val = i;

            fd = open(mpp_get_mpp_service_name(), O_RDWR | O_CLOEXEC);
            if (fd < 0) {
                mpp_err("open mpp_service to check cmd capability failed\n");
                break;
            }
            /* set client type first */
            ret = mpp_service_ioctl(fd, MPP_CMD_INIT_CLIENT_TYPE, sizeof(val), &val);
            if (ret) {
                mpp_err("check valid client type %d failed\n", i);
            } else {
                /* then get hw_id */
                ret = mpp_service_ioctl(fd, MPP_CMD_QUERY_HW_ID, sizeof(val), &val);
                if (!ret) {
                    mpp_dev_dbg_probe("client %-10s hw_id %08x\n",
                                      strof_client_type((MppClientType)i), val);
                    hw_ids[i] = val;
                } else
                    mpp_err("check valid client %-10s for hw_id failed\n",
                            strof_client_type((MppClientType)i));
            }
            close(fd);
        }
    }
}